

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O3

void boost::unit_test::utils::print_escaped(ostream *where_to,const_string *value)

{
  undefined1 uVar1;
  char *pcVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  long lVar7;
  undefined8 *puVar8;
  pair<const_char,_const_char_*> *ppVar9;
  _Base_ptr p_Var10;
  char *pcVar11;
  byte bVar12;
  initializer_list<std::pair<const_char,_const_char_*>_> __l;
  allocator_type local_82;
  less<char> local_81;
  pair<const_char,_const_char_*> local_80 [5];
  
  bVar12 = 0;
  if ((print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)::char_type == '\0')
     && (iVar3 = __cxa_guard_acquire(&print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)
                                      ::char_type), iVar3 != 0)) {
    puVar8 = &DAT_001c91c0;
    ppVar9 = local_80;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)ppVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      ppVar9 = (pair<const_char,_const_char_*> *)&ppVar9[-(ulong)bVar12].second;
    }
    __l._M_len = 5;
    __l._M_array = local_80;
    std::
    map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
    ::map(&print_escaped::char_type,__l,&local_81,&local_82);
    __cxa_atexit(std::
                 map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
                 ::~map,&print_escaped::char_type,&__dso_handle);
    __cxa_guard_release(&print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)::
                         char_type);
  }
  pcVar11 = value->m_begin;
  pcVar2 = value->m_end;
  if (pcVar11 != pcVar2) {
    do {
      local_80[0].first = *pcVar11;
      if (print_escaped::char_type._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
          (_Base_ptr)0x0) {
LAB_00192afe:
        std::__ostream_insert<char,std::char_traits<char>>(where_to,&local_80[0].first,1);
      }
      else {
        p_Var10 = &print_escaped::char_type._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var6 = print_escaped::char_type._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          uVar1 = (undefined1)p_Var6[1]._M_color;
          if (local_80[0].first <= (char)uVar1) {
            p_Var10 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[(char)uVar1 < local_80[0].first];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 ==
             &print_escaped::char_type._M_t._M_impl.super__Rb_tree_header) ||
           (local_80[0].first < (char)p_Var10[1]._M_color)) goto LAB_00192afe;
        local_80[0].first = '&';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(where_to,&local_80[0].first,1);
        p_Var6 = p_Var10[1]._M_parent;
        if (p_Var6 == (_Base_ptr)0x0) {
          std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
        }
        else {
          sVar5 = strlen((char *)p_Var6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)p_Var6,sVar5);
        }
        local_80[0].first = ';';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_80[0].first,1);
      }
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 != pcVar2);
  }
  return;
}

Assistant:

inline void
print_escaped( std::ostream& where_to, const_string value )
{
#if !defined(BOOST_NO_CXX11_HDR_INITIALIZER_LIST) && !defined(BOOST_NO_CXX11_UNIFIED_INITIALIZATION_SYNTAX)
    static std::map<char,char const*> const char_type{{
        {'<' , "lt"},
        {'>' , "gt"},
        {'&' , "amp"},
        {'\'', "apos"},
        {'"' , "quot"}
    }};
#else
    static std::map<char,char const*> char_type;

    if( char_type.empty() ) {
        char_type['<'] = "lt";
        char_type['>'] = "gt";
        char_type['&'] = "amp";
        char_type['\'']= "apos";
        char_type['"'] = "quot";
    }
#endif

    BOOST_TEST_FOREACH( char, c, value ) {
        std::map<char,char const*>::const_iterator found_ref = char_type.find( c );

        if( found_ref != char_type.end() )
            where_to << '&' << found_ref->second << ';';
        else
            where_to << c;
    }
}